

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O1

size_t __thiscall
BamTools::Internal::ByteArray::IndexOf(ByteArray *this,char c,size_t from,size_t to)

{
  pointer pcVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (to != 0) {
    uVar4 = to;
  }
  if (from < uVar4) {
    pcVar1 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar1;
    sVar2 = from;
    do {
      if (uVar3 <= sVar2) {
        if (from <= uVar3) {
          from = uVar3;
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",from,
                   uVar3);
      }
      if (pcVar1[sVar2] == c) {
        return sVar2;
      }
      sVar2 = sVar2 + 1;
    } while (uVar4 != sVar2);
  }
  return (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
}

Assistant:

std::size_t ByteArray::IndexOf(const char c, const std::size_t from, const std::size_t to) const
{
    const std::size_t size = ((to == 0) ? m_data.size() : to);
    for (std::size_t i = from; i < size; ++i) {
        if (m_data.at(i) == c) {
            return i;
        }
    }
    return m_data.size();
}